

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledFragmentAssembler.h
# Opt level: O0

ControlledPollAction __thiscall
aeron::ControlledFragmentAssembler::onFragment
          (ControlledFragmentAssembler *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  int iVar1;
  bool bVar2;
  uint32_t limit_00;
  uint32_t uVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int32_t iVar6;
  pointer ppVar7;
  this_t *this_00;
  BufferBuilder *this_01;
  uint8_t *buffer_00;
  DataFrameHeaderDefn *pDVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>,_bool>
  pVar9;
  DataFrameHeaderDefn *frame;
  undefined1 local_d0 [8];
  Header assemblyHeader;
  AtomicBuffer msgBuffer;
  index_t msgLength;
  uint32_t limit;
  BufferBuilder *builder_1;
  int32_t local_6c;
  _Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false> local_68;
  iterator result_1;
  BufferBuilder *builder;
  uint local_48;
  int32_t local_44;
  _Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false> local_40;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>,_bool>
  result;
  ControlledPollAction action;
  uint8_t flags;
  Header *header_local;
  index_t length_local;
  index_t offset_local;
  AtomicBuffer *buffer_local;
  ControlledFragmentAssembler *this_local;
  
  result._15_1_ = concurrent::logbuffer::Header::flags(header);
  result.second = true;
  result._9_3_ = 0;
  if ((result._15_1_ & 0xc0) == 0xc0) {
    result._8_4_ = std::
                   function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
                   ::operator()(&this->m_delegate,buffer,offset,length,header);
  }
  else if ((result._15_1_ & 0x80) == 0x80) {
    local_44 = concurrent::logbuffer::Header::sessionId(header);
    local_48 = (uint)this->m_initialBufferLength;
    pVar9 = std::
            unordered_map<int,aeron::BufferBuilder,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,aeron::BufferBuilder>>>
            ::emplace<int,unsigned_int>
                      ((unordered_map<int,aeron::BufferBuilder,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,aeron::BufferBuilder>>>
                        *)&this->m_builderBySessionIdMap,&local_44,&local_48);
    local_40._M_cur =
         (__node_type *)
         pVar9.first.super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>.
         _M_cur;
    result.first.super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>._M_cur
    ._0_1_ = pVar9.second;
    ppVar7 = std::__detail::_Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>
                           *)&local_40);
    result_1.super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>)&ppVar7->second;
    this_00 = BufferBuilder::reset
                        ((BufferBuilder *)
                         result_1.
                         super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                         ._M_cur);
    BufferBuilder::append(this_00,buffer,offset,length,header);
  }
  else {
    local_6c = concurrent::logbuffer::Header::sessionId(header);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_aeron::BufferBuilder,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_aeron::BufferBuilder>_>_>
         ::find(&this->m_builderBySessionIdMap,&local_6c);
    builder_1 = (BufferBuilder *)
                std::
                unordered_map<int,_aeron::BufferBuilder,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_aeron::BufferBuilder>_>_>
                ::end(&this->m_builderBySessionIdMap);
    bVar2 = std::__detail::operator!=
                      (&local_68,
                       (_Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false> *)
                       &builder_1);
    if (bVar2) {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>
                           *)&local_68);
      this_01 = &ppVar7->second;
      limit_00 = BufferBuilder::limit(this_01);
      uVar3 = BufferBuilder::limit(this_01);
      if ((uVar3 != 0x20) &&
         (BufferBuilder::append(this_01,buffer,offset,length,header), (result._15_1_ & 0x40) == 0x40
         )) {
        uVar3 = BufferBuilder::limit(this_01);
        buffer_00 = BufferBuilder::buffer(this_01);
        uVar4 = BufferBuilder::limit(this_01);
        concurrent::AtomicBuffer::AtomicBuffer
                  ((AtomicBuffer *)&assemblyHeader.m_positionBitsToShift,buffer_00,(ulong)uVar4);
        concurrent::logbuffer::Header::Header((Header *)local_d0,header);
        concurrent::logbuffer::Header::buffer
                  ((Header *)local_d0,(AtomicBuffer *)&assemblyHeader.m_positionBitsToShift);
        concurrent::logbuffer::Header::offset((Header *)local_d0,0);
        pDVar8 = concurrent::AtomicBuffer::
                 overlayStruct<aeron::concurrent::logbuffer::DataFrameHeader::DataFrameHeaderDefn>
                           ((AtomicBuffer *)&assemblyHeader.m_positionBitsToShift);
        pDVar8->frameLength = uVar3;
        iVar5 = concurrent::logbuffer::Header::sessionId(header);
        pDVar8->sessionId = iVar5;
        iVar5 = concurrent::logbuffer::Header::streamId(header);
        pDVar8->streamId = iVar5;
        iVar5 = concurrent::logbuffer::Header::termId(header);
        pDVar8->termId = iVar5;
        pDVar8->flags = 0xc0;
        pDVar8->type = 1;
        iVar5 = concurrent::logbuffer::Header::termOffset(header);
        iVar1 = pDVar8->frameLength;
        iVar6 = concurrent::logbuffer::Header::frameLength(header);
        pDVar8->termOffset = iVar5 + (iVar6 - iVar1);
        result._8_4_ = std::
                       function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
                       ::operator()(&this->m_delegate,
                                    (AtomicBuffer *)&assemblyHeader.m_positionBitsToShift,0x20,
                                    uVar3 - 0x20,(Header *)local_d0);
        if (result._8_4_ == ABORT) {
          BufferBuilder::limit(this_01,limit_00);
        }
        else {
          BufferBuilder::reset(this_01);
        }
        concurrent::logbuffer::Header::~Header((Header *)local_d0);
        concurrent::AtomicBuffer::~AtomicBuffer
                  ((AtomicBuffer *)&assemblyHeader.m_positionBitsToShift);
      }
    }
  }
  return result._8_4_;
}

Assistant:

ControlledPollAction onFragment(AtomicBuffer& buffer, util::index_t offset, util::index_t length, Header& header)
    {
        const std::uint8_t flags = header.flags();
        ControlledPollAction action = ControlledPollAction::CONTINUE;

        if ((flags & FrameDescriptor::UNFRAGMENTED) == FrameDescriptor::UNFRAGMENTED)
        {
            action = m_delegate(buffer, offset, length, header);
        }
        else
        {
            if ((flags & FrameDescriptor::BEGIN_FRAG) == FrameDescriptor::BEGIN_FRAG)
            {
                auto result = m_builderBySessionIdMap.emplace(header.sessionId(), static_cast<std::uint32_t>(m_initialBufferLength));
                BufferBuilder& builder = result.first->second;

                builder
                    .reset()
                    .append(buffer, offset, length, header);
            }
            else
            {
                auto result = m_builderBySessionIdMap.find(header.sessionId());

                if (result != m_builderBySessionIdMap.end())
                {
                    BufferBuilder& builder = result->second;
                    const std::uint32_t limit = builder.limit();

                    if (builder.limit() != DataFrameHeader::LENGTH)
                    {
                        builder.append(buffer, offset, length, header);

                        if ((flags & FrameDescriptor::END_FRAG) == FrameDescriptor::END_FRAG)
                        {
                            const util::index_t msgLength = builder.limit() - DataFrameHeader::LENGTH;
                            AtomicBuffer msgBuffer(builder.buffer(), builder.limit());
                            Header assemblyHeader(header);

                            assemblyHeader.buffer(msgBuffer);
                            assemblyHeader.offset(0);
                            DataFrameHeader::DataFrameHeaderDefn& frame(
                                msgBuffer.overlayStruct<DataFrameHeader::DataFrameHeaderDefn>());

                            frame.frameLength = DataFrameHeader::LENGTH + msgLength;
                            frame.sessionId = header.sessionId();
                            frame.streamId = header.streamId();
                            frame.termId = header.termId();
                            frame.flags = FrameDescriptor::UNFRAGMENTED;
                            frame.type = DataFrameHeader::HDR_TYPE_DATA;
                            frame.termOffset = header.termOffset() - (frame.frameLength - header.frameLength());

                            action = m_delegate(msgBuffer, DataFrameHeader::LENGTH, msgLength, assemblyHeader);

                            if (ControlledPollAction::ABORT == action)
                            {
                                builder.limit(limit);
                            }
                            else
                            {
                                builder.reset();
                            }
                        }
                    }
                }
            }
        }

        return action;
    }